

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O0

int archive_read_format_iso9660_bid(archive_read *a,int best_bid)

{
  int iVar1;
  void *pvVar2;
  iso9660 *iso9660_00;
  byte *h;
  int in_ESI;
  long in_RDI;
  int seenTerminator;
  uchar *p;
  ssize_t bytes_read;
  iso9660 *iso9660;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  int iVar3;
  archive_read *in_stack_ffffffffffffffd0;
  long in_stack_ffffffffffffffd8;
  iso9660 *iso9660_01;
  undefined4 in_stack_ffffffffffffffe8;
  int local_4;
  
  if (in_ESI < 0x31) {
    iso9660_01 = (iso9660 *)**(undefined8 **)(in_RDI + 0x948);
    pvVar2 = __archive_read_ahead
                       (in_stack_ffffffffffffffd0,
                        CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                        (ssize_t *)0x136309);
    if (pvVar2 == (void *)0x0) {
      local_4 = -1;
    }
    else {
      h = (byte *)((long)pvVar2 + 0x8000);
      iVar3 = 0;
      for (iso9660_00 = (iso9660 *)(in_stack_ffffffffffffffd8 + -0x8000); 0x800 < (long)iso9660_00;
          iso9660_00 = (iso9660 *)iso9660_00[-1].null) {
        if ((3 < *h) && (*h != 0xff)) {
          return 0;
        }
        iVar1 = memcmp(h + 1,"CD001",5);
        if (iVar1 != 0) {
          return 0;
        }
        iVar1 = isPVD((iso9660 *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),(uchar *)iso9660_01);
        if (((iVar1 == 0) &&
            (((((iso9660_01->joliet).location != 0 ||
               (iVar1 = isJolietSVD((iso9660 *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                                    (uchar *)iso9660_01), iVar1 == 0)) &&
              (iVar1 = isBootRecord(iso9660_01,h), iVar1 == 0)) &&
             ((iVar1 = isEVD((iso9660 *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                             (uchar *)iso9660_01), iVar1 == 0 &&
              (iVar1 = isSVD((iso9660 *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                             (uchar *)iso9660_01), iVar1 == 0)))))) &&
           (iVar1 = isVolumePartition(iso9660_00,h), iVar1 == 0)) {
          iVar3 = isVDSetTerminator((iso9660 *)CONCAT44(iVar3,in_stack_ffffffffffffffc8),
                                    (uchar *)0x136458);
          if (iVar3 == 0) {
            return 0;
          }
          iVar3 = 1;
          break;
        }
        h = h + 0x800;
      }
      if ((iVar3 == 0) || ((iso9660_01->primary).location < 0x11)) {
        local_4 = 0;
      }
      else {
        local_4 = 0x30;
      }
    }
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

static int
archive_read_format_iso9660_bid(struct archive_read *a, int best_bid)
{
	struct iso9660 *iso9660;
	ssize_t bytes_read;
	const unsigned char *p;
	int seenTerminator;

	/* If there's already a better bid than we can ever
	   make, don't bother testing. */
	if (best_bid > 48)
		return (-1);

	iso9660 = (struct iso9660 *)(a->format->data);

	/*
	 * Skip the first 32k (reserved area) and get the first
	 * 8 sectors of the volume descriptor table.  Of course,
	 * if the I/O layer gives us more, we'll take it.
	 */
#define RESERVED_AREA	(SYSTEM_AREA_BLOCK * LOGICAL_BLOCK_SIZE)
	p = __archive_read_ahead(a,
	    RESERVED_AREA + 8 * LOGICAL_BLOCK_SIZE,
	    &bytes_read);
	if (p == NULL)
	    return (-1);

	/* Skip the reserved area. */
	bytes_read -= RESERVED_AREA;
	p += RESERVED_AREA;

	/* Check each volume descriptor. */
	seenTerminator = 0;
	for (; bytes_read > LOGICAL_BLOCK_SIZE;
	    bytes_read -= LOGICAL_BLOCK_SIZE, p += LOGICAL_BLOCK_SIZE) {
		/* Do not handle undefined Volume Descriptor Type. */
		if (p[0] >= 4 && p[0] <= 254)
			return (0);
		/* Standard Identifier must be "CD001" */
		if (memcmp(p + 1, "CD001", 5) != 0)
			return (0);
		if (isPVD(iso9660, p))
			continue;
		if (!iso9660->joliet.location) {
			if (isJolietSVD(iso9660, p))
				continue;
		}
		if (isBootRecord(iso9660, p))
			continue;
		if (isEVD(iso9660, p))
			continue;
		if (isSVD(iso9660, p))
			continue;
		if (isVolumePartition(iso9660, p))
			continue;
		if (isVDSetTerminator(iso9660, p)) {
			seenTerminator = 1;
			break;
		}
		return (0);
	}
	/*
	 * ISO 9660 format must have Primary Volume Descriptor and
	 * Volume Descriptor Set Terminator.
	 */
	if (seenTerminator && iso9660->primary.location > 16)
		return (48);

	/* We didn't find a valid PVD; return a bid of zero. */
	return (0);
}